

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O0

float StrToF16(uc16 *str16,int length,int flags,double empty_string_value,
              int *processed_characters_count,bool *processed_all)

{
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  undefined8 in_R8;
  float fVar1;
  uc16 *in_XMM0_Qa;
  double junk_string_value;
  double result;
  StringToDoubleConverter converter;
  int *in_stack_ffffffffffffff88;
  StringToDoubleConverter *in_stack_ffffffffffffffa0;
  StringToDoubleConverter local_58;
  undefined8 local_28;
  int *local_20;
  int local_c;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_c = in_ESI;
  junk_string_value = double_conversion::Double::NaN();
  double_conversion::StringToDoubleConverter::StringToDoubleConverter
            (&local_58,in_EDX,(double)in_XMM0_Qa,junk_string_value,(char *)0x0,(char *)0x0,0);
  fVar1 = double_conversion::StringToDoubleConverter::StringToFloat
                    (in_stack_ffffffffffffffa0,in_XMM0_Qa,in_EDX,in_stack_ffffffffffffff88);
  *(bool *)local_28 = local_c == *local_20;
  return fVar1;
}

Assistant:

static float StrToF16(const uc16* str16, int length, int flags,
                      double empty_string_value,
                      int* processed_characters_count,
                      bool* processed_all) {
  StringToDoubleConverter converter(flags, empty_string_value, Double::NaN(),
                                    NULL, NULL);
  double result =
      converter.StringToFloat(str16, length, processed_characters_count);
  *processed_all = (length == *processed_characters_count);
  return result;
}